

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_constrain_curvature(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL *metric;
  long lVar2;
  int iVar3;
  REF_DBL *m1;
  REF_DBL m_constrained [6];
  REF_DBL m [6];
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x50f,
           "ref_metric_constrain_curvature","malloc curvature_metric of REF_DBL negative");
    uVar1 = 1;
  }
  else {
    metric = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x50f,"ref_metric_constrain_curvature","malloc curvature_metric of REF_DBL NULL");
      uVar1 = 2;
    }
    else {
      uVar1 = ref_metric_from_curvature(metric,ref_grid);
      if (uVar1 == 0) {
        iVar3 = 0x14;
        do {
          uVar1 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x514,"ref_metric_constrain_curvature",(ulong)uVar1,"grad");
            return uVar1;
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        if (0 < ref_node->max) {
          lVar2 = 0;
          m1 = metric;
          do {
            if (-1 < ref_node->global[lVar2]) {
              uVar1 = ref_node_metric_get(ref_node,(REF_INT)lVar2,local_68);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x518,"ref_metric_constrain_curvature",(ulong)uVar1,"get");
                return uVar1;
              }
              uVar1 = ref_matrix_intersect(m1,local_68,local_98);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x51a,"ref_metric_constrain_curvature",(ulong)uVar1,"intersect");
                return uVar1;
              }
              if ((ref_grid->twod != 0) && (uVar1 = ref_matrix_twod_m(local_98), uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x51c,"ref_metric_constrain_curvature",(ulong)uVar1,"enforce twod");
                return uVar1;
              }
              uVar1 = ref_node_metric_set(ref_node,(REF_INT)lVar2,local_98);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x51d,"ref_metric_constrain_curvature",(ulong)uVar1,"set node met");
                return uVar1;
              }
            }
            lVar2 = lVar2 + 1;
            m1 = m1 + 6;
          } while (lVar2 < ref_node->max);
        }
        free(metric);
        uVar1 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x510,"ref_metric_constrain_curvature",(ulong)uVar1,"curve");
      }
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_constrain_curvature(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *curvature_metric;
  REF_DBL m[6], m_constrained[6];
  REF_INT node, gradation;

  ref_malloc(curvature_metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_curvature(curvature_metric, ref_grid), "curve");
  for (gradation = 0; gradation < 20; gradation++) {
    RSS(ref_metric_mixed_space_gradation(curvature_metric, ref_grid, -1.0,
                                         -1.0),
        "grad");
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_matrix_intersect(&(curvature_metric[6 * node]), m, m_constrained),
        "intersect");
    if (ref_grid_twod(ref_grid))
      RSS(ref_matrix_twod_m(m_constrained), "enforce twod");
    RSS(ref_node_metric_set(ref_node, node, m_constrained), "set node met");
  }

  ref_free(curvature_metric);

  return REF_SUCCESS;
}